

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# any.cc
# Opt level: O3

void __thiscall
google::protobuf::internal::AnyMetadata::PackFrom
          (AnyMetadata *this,Message *message,string *type_url_prefix)

{
  ArenaStringPtr *pAVar1;
  undefined8 *puVar2;
  int iVar3;
  undefined4 extraout_var;
  string *output;
  stringpiece_ssize_type in_R9;
  StringPiece message_name;
  StringPiece type_url_prefix_00;
  string local_40;
  
  pAVar1 = this->type_url_;
  InitProtobufDefaults();
  iVar3 = (*(message->super_MessageLite)._vptr_MessageLite[0x15])(message);
  puVar2 = *(undefined8 **)(CONCAT44(extraout_var,iVar3) + 8);
  message_name.length_ = (stringpiece_ssize_type)(type_url_prefix->_M_dataplus)._M_p;
  message_name.ptr_ = (char *)puVar2[1];
  type_url_prefix_00.length_ = in_R9;
  type_url_prefix_00.ptr_ = (char *)type_url_prefix->_M_string_length;
  GetTypeUrl_abi_cxx11_(&local_40,(internal *)*puVar2,message_name,type_url_prefix_00);
  ArenaStringPtr::SetNoArena(pAVar1,(string *)&fixed_address_empty_string_abi_cxx11_,&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p);
  }
  pAVar1 = this->value_;
  output = pAVar1->ptr_;
  if (output == (string *)&fixed_address_empty_string_abi_cxx11_) {
    ArenaStringPtr::CreateInstanceNoArena(pAVar1,(string *)&fixed_address_empty_string_abi_cxx11_);
    output = pAVar1->ptr_;
  }
  MessageLite::SerializeToString(&message->super_MessageLite,output);
  return;
}

Assistant:

void AnyMetadata::PackFrom(const Message& message,
                           const std::string& type_url_prefix) {
  type_url_->SetNoArena(
      &::PROTOBUF_NAMESPACE_ID::internal::GetEmptyString(),
      GetTypeUrl(message.GetDescriptor()->full_name(), type_url_prefix));
  message.SerializeToString(value_->MutableNoArena(
      &::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited()));
}